

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

longlong __thiscall fmt::v5::file::size(file *this)

{
  string_view message;
  int iVar1;
  basic_string_view<char> *this_00;
  int *in_RDI;
  Stat file_stat;
  char *in_stack_ffffffffffffff28;
  undefined1 local_98 [36];
  int in_stack_ffffffffffffff8c;
  system_error *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  
  memset(local_98,0,0x90);
  iVar1 = fstat(*in_RDI,(stat *)local_98);
  if (iVar1 == -1) {
    this_00 = (basic_string_view<char> *)__cxa_allocate_exception(0x18);
    __errno_location();
    basic_string_view<char>::basic_string_view(this_00,in_stack_ffffffffffffff28);
    message.size_ = in_stack_ffffffffffffffa0;
    message.data_ = in_stack_ffffffffffffff98;
    system_error::system_error<>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,message);
    __cxa_throw(this_00,&system_error::typeinfo,system_error::~system_error);
  }
  return (longlong)in_stack_ffffffffffffff98;
}

Assistant:

long long file::size() const {
#ifdef _WIN32
  // Use GetFileSize instead of GetFileSizeEx for the case when _WIN32_WINNT
  // is less than 0x0500 as is the case with some default MinGW builds.
  // Both functions support large file sizes.
  DWORD size_upper = 0;
  HANDLE handle = reinterpret_cast<HANDLE>(_get_osfhandle(fd_));
  DWORD size_lower = FMT_SYSTEM(GetFileSize(handle, &size_upper));
  if (size_lower == INVALID_FILE_SIZE) {
    DWORD error = GetLastError();
    if (error != NO_ERROR)
      FMT_THROW(windows_error(GetLastError(), "cannot get file size"));
  }
  unsigned long long long_size = size_upper;
  return (long_size << sizeof(DWORD) * CHAR_BIT) | size_lower;
#else
  typedef struct stat Stat;
  Stat file_stat = Stat();
  if (FMT_POSIX_CALL(fstat(fd_, &file_stat)) == -1)
    FMT_THROW(system_error(errno, "cannot get file attributes"));
  static_assert(sizeof(long long) >= sizeof(file_stat.st_size),
      "return type of file::size is not large enough");
  return file_stat.st_size;
#endif
}